

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
pstore::json::details::number_matcher<pstore::json::null_output>::do_frac_state
          (number_matcher<pstore::json::null_output> *this,parser<pstore::json::null_output> *parser
          ,char c)

{
  error_code local_30;
  byte local_1a;
  char local_19;
  bool match;
  parser<pstore::json::null_output> *ppStack_18;
  char c_local;
  parser<pstore::json::null_output> *parser_local;
  number_matcher<pstore::json::null_output> *this_local;
  
  local_1a = 1;
  local_19 = c;
  ppStack_18 = parser;
  parser_local = (parser<pstore::json::null_output> *)this;
  if (c == '.') {
    matcher<pstore::json::null_output>::set_state(&this->super_matcher<pstore::json::null_output>,6)
    ;
  }
  else if ((c == 'e') || (c == 'E')) {
    matcher<pstore::json::null_output>::set_state(&this->super_matcher<pstore::json::null_output>,8)
    ;
  }
  else if ((c < '0') || ('9' < c)) {
    local_1a = 0;
    complete(this,parser);
  }
  else {
    std::error_code::error_code<pstore::json::error_code,void>(&local_30,number_out_of_range);
    matcher<pstore::json::null_output>::set_error
              (&this->super_matcher<pstore::json::null_output>,parser,&local_30);
  }
  return (bool)(local_1a & 1);
}

Assistant:

bool number_matcher<Callbacks>::do_frac_state (parser<Callbacks> & parser,
                                                           char const c) {
                bool match = true;
                if (c == '.') {
                    this->set_state (frac_initial_digit_state);
                } else if (c == 'e' || c == 'E') {
                    this->set_state (exponent_sign_state);
                } else if (c >= '0' && c <= '9') {
                    // digits are definitely not part of the next token so we can issue an error
                    // right here.
                    this->set_error (parser, error_code::number_out_of_range);
                } else {
                    // the 'frac' production is optional.
                    match = false;
                    this->complete (parser);
                }
                return match;
            }